

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::MultiNode
          (MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *this,
          MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *other)

{
  CacheInfo *this_00;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  Chain *chain;
  Chain **e;
  Chain *c;
  CacheInfo *in_stack_ffffffffffffffc8;
  CacheInfo *local_20;
  long local_18;
  
  *in_RDI = *in_RSI;
  local_20 = (CacheInfo *)(in_RDI + 1);
  for (local_18 = in_RSI[1]; local_18 != 0; local_18 = *(long *)(local_18 + 0x30)) {
    this_00 = (CacheInfo *)operator_new(0x38);
    QOpenGL2GradientCache::CacheInfo::CacheInfo(this_00,in_stack_ffffffffffffffc8);
    *(undefined8 *)(this_00 + 1) = 0;
    *(CacheInfo **)local_20 = this_00;
    local_20 = this_00 + 1;
  }
  return;
}

Assistant:

MultiNode(const MultiNode &other)
        : key(other.key)
    {
        Chain *c = other.value;
        Chain **e = &value;
        while (c) {
            Chain *chain = new Chain{ c->value, nullptr };
            *e = chain;
            e = &chain->next;
            c = c->next;
        }
    }